

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall MatroskaDemuxer::ebml_read_master(MatroskaDemuxer *this,uint32_t *id)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  undefined4 *puVar4;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  int64_t length;
  ostringstream ss;
  
  iVar1 = ebml_read_element_id(this,id,(int *)0x0);
  if (-1 < iVar1) {
    iVar1 = ebml_read_element_length(this,&length);
    if (-1 < iVar1) {
      lVar2 = (long)this->num_levels;
      if (0xf < lVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,"File moves beyond max. allowed depth (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x10);
        std::operator<<(poVar3,")");
        puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar4 = 900;
        *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
        if (local_1b0 == &local_1a0) {
          puVar4[6] = local_1a0;
          puVar4[7] = uStack_19c;
          puVar4[8] = uStack_198;
          puVar4[9] = uStack_194;
        }
        else {
          *(uint **)(puVar4 + 2) = local_1b0;
          *(ulong *)(puVar4 + 6) = CONCAT44(uStack_19c,local_1a0);
        }
        *(undefined8 *)(puVar4 + 4) = local_1a8;
        local_1a0 = local_1a0 & 0xffffff00;
        __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      this->num_levels = this->num_levels + 1;
      this->levels[lVar2].start = (this->super_IOContextDemuxer).m_processedBytes;
      this->levels[lVar2].length = length;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int MatroskaDemuxer::ebml_read_master(uint32_t *id)
{
    int64_t length;
    int res;

    if ((res = ebml_read_element_id(id, nullptr)) < 0 || (res = ebml_read_element_length(&length)) < 0)
        return res;

    /* protect... (Heaven forbids that the '>' is true) */
    if (num_levels >= EBML_MAX_DEPTH)
    {
        THROW(ERR_MATROSKA_PARSE, "File moves beyond max. allowed depth (" << EBML_MAX_DEPTH << ")")
    }

    /* remember level */
    MatroskaLevel *level = &levels[num_levels++];
    level->start = m_processedBytes;
    level->length = length;
    return 0;
}